

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_info_raw(stbi__jpeg *j,int *x,int *y,int *comp)

{
  int iVar1;
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  stbi__jpeg *in_RSI;
  long *in_RDI;
  int local_4;
  
  iVar1 = stbi__decode_jpeg_header(in_RSI,(int)((ulong)in_RDX >> 0x20));
  if (iVar1 == 0) {
    stbi__rewind((stbi__context *)*in_RDI);
    local_4 = 0;
  }
  else {
    if (in_RSI != (stbi__jpeg *)0x0) {
      *(undefined4 *)&in_RSI->s = *(undefined4 *)*in_RDI;
    }
    if (in_RDX != (undefined4 *)0x0) {
      *in_RDX = *(undefined4 *)(*in_RDI + 4);
    }
    if (in_RCX != (undefined4 *)0x0) {
      *in_RCX = *(undefined4 *)(*in_RDI + 8);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_info_raw(stbi__jpeg *j, int *x, int *y, int *comp)
{
   if (!stbi__decode_jpeg_header(j, STBI__SCAN_header)) {
      stbi__rewind( j->s );
      return 0;
   }
   if (x) *x = j->s->img_x;
   if (y) *y = j->s->img_y;
   if (comp) *comp = j->s->img_n;
   return 1;
}